

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTuples.cpp
# Opt level: O2

int main(void)

{
  Session *pSVar1;
  atomic<unsigned_long> aVar2;
  cx_string<2UL> cVar3;
  SessionWriter *pSVar4;
  __atomic_base<unsigned_long> _Var5;
  nanoseconds nVar6;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *out;
  cx_string<10UL> cVar7;
  tuple<> empty;
  pair<int,_char> p;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
  t;
  allocator local_1f6;
  allocator local_1f5;
  allocator local_1f4;
  tuple<> local_1f3;
  allocator local_1f2;
  allocator local_1f1;
  pair<int,_char> local_1f0;
  undefined1 local_1e8 [40];
  ConsumeResult local_1c0;
  undefined1 local_1a0 [48];
  string local_170 [32];
  string local_150 [32];
  uint64_t local_130;
  string local_128 [32];
  string local_108 [32];
  undefined1 local_e8 [48];
  string local_b8 [32];
  string local_98 [32];
  uint64_t local_78;
  string local_70 [32];
  string local_50 [32];
  
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_e8._0_8_ = 0;
      local_e8._8_2_ = info;
      std::__cxx11::string::string((string *)(local_e8 + 0x10),"main",(allocator *)&local_1c0);
      std::__cxx11::string::string(local_b8,"main",(allocator *)&local_1f0);
      std::__cxx11::string::string
                (local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingTuples.cpp"
                 ,&local_1f4);
      local_78 = 0xc;
      std::__cxx11::string::string(local_70,"Empty tuple: {}",&local_1f5);
      cVar3 = binlog::detail::concatenated_tags<char_const(&)[16],std::tuple<>&>
                        ((char (*) [16])"Empty tuple: {}",&local_1f3);
      local_1e8[0] = cVar3._data[0];
      local_1e8[1] = cVar3._data[1];
      local_1e8[2] = cVar3._data[2];
      std::__cxx11::string::string(local_50,local_1e8,&local_1f6);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_e8);
      binlog::EventSource::~EventSource((EventSource *)local_e8);
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<std::tuple<>&>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r,&local_1f3);
  }
  local_1f0.first = 1;
  local_1f0.second = 'a';
  local_1e8._0_4_ = 2;
  local_1e8[4] = true;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[4]>
            ((_Head_base<0ul,std::__cxx11::string,false> *)(local_1e8 + 8),(char (*) [4])"foo");
  pSVar4 = binlog::default_thread_local_writer();
  out = extraout_RDX;
  if ((pSVar4->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_1a0._0_8_ = 0;
      local_1a0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_1a0 + 0x10),"main",&local_1f4);
      std::__cxx11::string::string(local_170,"main",&local_1f5);
      std::__cxx11::string::string
                (local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingTuples.cpp"
                 ,&local_1f6);
      local_130 = 0x12;
      std::__cxx11::string::string(local_128,"Pair: {}, Tuple: {}",&local_1f1);
      cVar7 = binlog::detail::
              concatenated_tags<char_const(&)[20],std::pair<int,char>&,std::tuple<std::__cxx11::string,bool,int>&>
                        ((char (*) [20])"Pair: {}, Tuple: {}",&local_1f0,
                         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
                          *)local_1e8);
      local_1c0.bytesConsumed = cVar7._data._0_8_;
      local_1c0.totalBytesConsumed._0_2_ = cVar7._data._8_2_;
      local_1c0.totalBytesConsumed._2_1_ = cVar7._data[10];
      std::__cxx11::string::string(local_108,(char *)&local_1c0,&local_1f2);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_1a0);
      binlog::EventSource::~EventSource((EventSource *)local_1a0);
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<std::pair<int,char>&,std::tuple<std::__cxx11::string,bool,int>&>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r,&local_1f0,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
                *)local_1e8);
    out = extraout_RDX_00;
  }
  binlog::consume<std::ostream>(&local_1c0,(binlog *)&std::cout,out);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  return 0;
}

Assistant:

int main()
{
  std::tuple<> empty;
  BINLOG_INFO("Empty tuple: {}", empty);
  // Outputs: Empty tuple: ()

  //[stdtup
  std::pair<int, char> p{1, 'a'};
  std::tuple<std::string, bool, int> t{"foo", true, 2};
  BINLOG_INFO("Pair: {}, Tuple: {}", p, t);
  // Outputs: Pair: (1, a), Tuple: (foo, true, 2)
  //]

  binlog::consume(std::cout);
  return 0;
}